

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FConsoleCommand *
ScanChainForName(FConsoleCommand *start,char *name,size_t namelen,FConsoleCommand **prev)

{
  int iVar1;
  int comp;
  FConsoleCommand **prev_local;
  size_t namelen_local;
  char *name_local;
  FConsoleCommand *start_local;
  
  *prev = (FConsoleCommand *)0x0;
  name_local = (char *)start;
  while( true ) {
    if (name_local == (char *)0x0) {
      return (FConsoleCommand *)0x0;
    }
    iVar1 = strncasecmp(*(char **)(name_local + 0x18),name,namelen);
    if (0 < iVar1) break;
    if ((iVar1 == 0) && (*(char *)(*(long *)(name_local + 0x18) + namelen) == '\0')) {
      return (FConsoleCommand *)name_local;
    }
    *prev = (FConsoleCommand *)name_local;
    name_local = *(char **)(name_local + 8);
  }
  return (FConsoleCommand *)0x0;
}

Assistant:

static FConsoleCommand *ScanChainForName (FConsoleCommand *start, const char *name, size_t namelen, FConsoleCommand **prev)
{
	int comp;

	*prev = NULL;
	while (start)
	{
		comp = strnicmp (start->m_Name, name, namelen);
		if (comp > 0)
			return NULL;
		else if (comp == 0 && start->m_Name[namelen] == 0)
			return start;

		*prev = start;
		start = start->m_Next;
	}
	return NULL;
}